

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O0

void shortcut_in_cb(Shortcut_Button *i,void *v)

{
  Fl_Button *this;
  Fl_Input_ *this_00;
  Fl_Value_Input *this_01;
  Fl_Text_Display *this_02;
  bool bVar1;
  int iVar2;
  Fl_Text_Display *b_3;
  Fl_Value_Input *b_2;
  Fl_Input_ *b_1;
  Fl_Button *b;
  Fl_Type *o;
  int mod;
  void *v_local;
  Shortcut_Button *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x18])();
    if (iVar2 == 0) {
      iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x19])();
      if (iVar2 == 0) {
        iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1a])();
        if (iVar2 == 0) {
          iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1b])();
          if (iVar2 == 0) {
            (*(i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[6])();
            return;
          }
          iVar2 = Fl_Text_Display::shortcut((Fl_Text_Display *)current_widget->o);
          i->svalue = iVar2;
        }
        else {
          iVar2 = Fl_Value_Input::shortcut((Fl_Value_Input *)current_widget->o);
          i->svalue = iVar2;
        }
      }
      else {
        iVar2 = Fl_Input_::shortcut((Fl_Input_ *)current_widget->o);
        i->svalue = iVar2;
      }
    }
    else {
      iVar2 = Fl_Button::shortcut((Fl_Button *)current_widget->o);
      i->svalue = iVar2;
    }
    (*(i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[5])();
    Fl_Widget::redraw((Fl_Widget *)i);
  }
  else {
    bVar1 = false;
    for (b = (Fl_Button *)Fl_Type::first; b != (Fl_Button *)0x0;
        b = *(Fl_Button **)&(b->super_Fl_Widget).label_.color) {
      if ((*(char *)((long)&(b->super_Fl_Widget).label_.deimage + 1) == '\0') ||
         (iVar2 = (*(b->super_Fl_Widget)._vptr_Fl_Widget[0x18])(), iVar2 == 0)) {
        if ((*(char *)((long)&(b->super_Fl_Widget).label_.deimage + 1) == '\0') ||
           (iVar2 = (*(b->super_Fl_Widget)._vptr_Fl_Widget[0x19])(), iVar2 == 0)) {
          if ((*(char *)((long)&(b->super_Fl_Widget).label_.deimage + 1) == '\0') ||
             (iVar2 = (*(b->super_Fl_Widget)._vptr_Fl_Widget[0x1a])(), iVar2 == 0)) {
            if ((*(char *)((long)&(b->super_Fl_Widget).label_.deimage + 1) != '\0') &&
               (iVar2 = (*(b->super_Fl_Widget)._vptr_Fl_Widget[0x1b])(), iVar2 != 0)) {
              this_02 = *(Fl_Text_Display **)&b[1].super_Fl_Widget.label_.color;
              iVar2 = Fl_Text_Display::shortcut(this_02);
              if (iVar2 != i->svalue) {
                bVar1 = true;
              }
              Fl_Text_Display::shortcut(this_02,i->svalue);
            }
          }
          else {
            this_01 = *(Fl_Value_Input **)&b[1].super_Fl_Widget.label_.color;
            iVar2 = Fl_Value_Input::shortcut(this_01);
            if (iVar2 != i->svalue) {
              bVar1 = true;
            }
            Fl_Value_Input::shortcut(this_01,i->svalue);
          }
        }
        else {
          this_00 = *(Fl_Input_ **)&b[1].super_Fl_Widget.label_.color;
          iVar2 = Fl_Input_::shortcut(this_00);
          if (iVar2 != i->svalue) {
            bVar1 = true;
          }
          Fl_Input_::shortcut(this_00,i->svalue);
        }
      }
      else {
        this = *(Fl_Button **)&b[1].super_Fl_Widget.label_.color;
        iVar2 = Fl_Button::shortcut(this);
        if (iVar2 != i->svalue) {
          bVar1 = true;
        }
        Fl_Button::shortcut(this,i->svalue);
        iVar2 = (*(b->super_Fl_Widget)._vptr_Fl_Widget[0x1e])();
        if (iVar2 != 0) {
          Fl_Widget_Type::redraw((Fl_Widget_Type *)b);
        }
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void shortcut_in_cb(Shortcut_Button* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_button())
      i->svalue = ((Fl_Button*)(current_widget->o))->shortcut();
    else if (current_widget->is_input())
      i->svalue = ((Fl_Input_*)(current_widget->o))->shortcut();
    else if (current_widget->is_value_input())
      i->svalue = ((Fl_Value_Input*)(current_widget->o))->shortcut();
    else if (current_widget->is_text_display())
      i->svalue = ((Fl_Text_Display*)(current_widget->o))->shortcut();
    else {
      i->hide();
      return;
    }
    i->show();
    i->redraw();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next)
      if (o->selected && o->is_button()) {
	Fl_Button* b = (Fl_Button*)(((Fl_Widget_Type*)o)->o);
        if (b->shortcut()!=i->svalue) mod = 1;
	b->shortcut(i->svalue);
	if (o->is_menu_item()) ((Fl_Widget_Type*)o)->redraw();
      } else if (o->selected && o->is_input()) {
	Fl_Input_* b = (Fl_Input_*)(((Fl_Widget_Type*)o)->o);
        if (b->shortcut()!=i->svalue) mod = 1;
	b->shortcut(i->svalue);
      } else if (o->selected && o->is_value_input()) {
	Fl_Value_Input* b = (Fl_Value_Input*)(((Fl_Widget_Type*)o)->o);
        if (b->shortcut()!=i->svalue) mod = 1;
	b->shortcut(i->svalue);
      } else if (o->selected && o->is_text_display()) {
	Fl_Text_Display* b = (Fl_Text_Display*)(((Fl_Widget_Type*)o)->o);
        if (b->shortcut()!=i->svalue) mod = 1;
	b->shortcut(i->svalue);
      }
    if (mod) set_modflag(1);
  }
}